

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O1

void test_bson_iter_recurse(void)

{
  char cVar1;
  int iVar2;
  bson_t *pbVar3;
  char *pcVar4;
  ulong uVar5;
  bson_t *pbVar6;
  bson_t *pbVar7;
  bson_t *pbVar8;
  TestSuite *suite;
  undefined8 unaff_R14;
  bson_t *pbVar9;
  bson_iter_t child;
  bson_t cb;
  bson_iter_t iter;
  bson_t b;
  undefined1 auStack_1b98 [4104];
  bson_t *pbStack_b90;
  code *pcStack_b88;
  undefined8 uStack_b10;
  undefined1 uStack_b08;
  TestSuite aTStack_b00 [5];
  code *pcStack_a08;
  int *piStack_990;
  int iStack_988;
  undefined1 auStack_984 [4];
  undefined1 auStack_980 [232];
  bson_t *pbStack_898;
  undefined1 *puStack_890;
  code *pcStack_888;
  bson_t bStack_880;
  bson_t abStack_800 [2];
  undefined8 uStack_6c8;
  char *pcStack_6c0;
  bson_t *pbStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  bson_t *pbStack_6a0;
  char *pcStack_698;
  code *pcStack_688;
  undefined1 auStack_680 [128];
  undefined1 auStack_600 [232];
  undefined1 *puStack_518;
  code *pcStack_508;
  undefined1 auStack_500 [128];
  undefined1 auStack_480 [368];
  undefined1 *puStack_310;
  code *pcStack_308;
  undefined1 auStack_300 [128];
  undefined1 local_280 [128];
  undefined1 local_200 [128];
  undefined1 local_180 [368];
  
  pcStack_308 = (code *)0x12b6ee;
  bson_init(local_180);
  pcStack_308 = (code *)0x12b6fe;
  bson_init(local_280);
  pcStack_308 = (code *)0x12b714;
  cVar1 = bson_append_int32(local_280,"0",1,0);
  if (cVar1 == '\0') {
    pcStack_308 = (code *)0x12b84e;
    test_bson_iter_recurse_cold_1();
LAB_0012b84e:
    pcStack_308 = (code *)0x12b853;
    test_bson_iter_recurse_cold_2();
LAB_0012b853:
    pcStack_308 = (code *)0x12b858;
    test_bson_iter_recurse_cold_3();
LAB_0012b858:
    pcStack_308 = (code *)0x12b85d;
    test_bson_iter_recurse_cold_4();
LAB_0012b85d:
    pcStack_308 = (code *)0x12b862;
    test_bson_iter_recurse_cold_5();
LAB_0012b862:
    pcStack_308 = (code *)0x12b867;
    test_bson_iter_recurse_cold_6();
LAB_0012b867:
    pcStack_308 = (code *)0x12b86c;
    test_bson_iter_recurse_cold_7();
LAB_0012b86c:
    pcStack_308 = (code *)0x12b871;
    test_bson_iter_recurse_cold_8();
LAB_0012b871:
    pcStack_308 = (code *)0x12b876;
    test_bson_iter_recurse_cold_9();
LAB_0012b876:
    pcStack_308 = (code *)0x12b87b;
    test_bson_iter_recurse_cold_10();
  }
  else {
    pcStack_308 = (code *)0x12b73a;
    cVar1 = bson_append_int32(local_280,"1",1,1);
    if (cVar1 == '\0') goto LAB_0012b84e;
    pcStack_308 = (code *)0x12b760;
    cVar1 = bson_append_int32(local_280,"2",1,2);
    if (cVar1 == '\0') goto LAB_0012b853;
    pcStack_308 = (code *)0x12b789;
    cVar1 = bson_append_array(local_180,"key",0xffffffff,local_280);
    if (cVar1 == '\0') goto LAB_0012b858;
    pcStack_308 = (code *)0x12b7ad;
    cVar1 = bson_iter_init_find(local_200,local_180,"key");
    if (cVar1 == '\0') goto LAB_0012b85d;
    pcStack_308 = (code *)0x12b7c2;
    iVar2 = bson_iter_type(local_200);
    if (iVar2 != 4) goto LAB_0012b862;
    pcStack_308 = (code *)0x12b7db;
    cVar1 = bson_iter_recurse(local_200,auStack_300);
    if (cVar1 == '\0') goto LAB_0012b867;
    pcStack_308 = (code *)0x12b7f2;
    cVar1 = bson_iter_find(auStack_300,"0");
    if (cVar1 == '\0') goto LAB_0012b86c;
    pcStack_308 = (code *)0x12b805;
    cVar1 = bson_iter_find(auStack_300,"1");
    if (cVar1 == '\0') goto LAB_0012b871;
    pcStack_308 = (code *)0x12b818;
    cVar1 = bson_iter_find(auStack_300,"2");
    if (cVar1 == '\0') goto LAB_0012b876;
    pcStack_308 = (code *)0x12b824;
    cVar1 = bson_iter_next(auStack_300);
    if (cVar1 == '\0') {
      pcStack_308 = (code *)0x12b835;
      bson_destroy(local_180);
      pcStack_308 = (code *)0x12b842;
      bson_destroy(local_280);
      return;
    }
  }
  pcStack_308 = test_bson_iter_init_find_case;
  test_bson_iter_recurse_cold_11();
  pcStack_508 = (code *)0x12b8a0;
  puStack_310 = local_280;
  pcStack_308 = (code *)&stack0xfffffffffffffff8;
  bson_init(auStack_480);
  pcStack_508 = (code *)0x12b8b9;
  cVar1 = bson_append_int32(auStack_480,"FOO",0xffffffff,0x4d2);
  if (cVar1 == '\0') {
    pcStack_508 = (code *)0x12b900;
    test_bson_iter_init_find_case_cold_1();
LAB_0012b900:
    pcStack_508 = (code *)0x12b905;
    test_bson_iter_init_find_case_cold_2();
  }
  else {
    pcStack_508 = (code *)0x12b8d4;
    cVar1 = bson_iter_init_find_case(auStack_500,auStack_480,"foo");
    if (cVar1 == '\0') goto LAB_0012b900;
    pcStack_508 = (code *)0x12b8e0;
    iVar2 = bson_iter_int32(auStack_500);
    if (iVar2 == 0x4d2) {
      pcStack_508 = (code *)0x12b8f4;
      bson_destroy(auStack_480);
      return;
    }
  }
  pcStack_508 = test_bson_iter_find_descendant;
  test_bson_iter_init_find_case_cold_3();
  pcStack_688 = (code *)0x12b928;
  puStack_518 = auStack_480;
  pcStack_508 = (code *)&pcStack_308;
  pbVar3 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/dotkey.bson"
                   );
  pcStack_688 = (code *)0x12b93b;
  cVar1 = bson_iter_init(auStack_600,pbVar3);
  if (cVar1 == '\0') {
    pcStack_688 = (code *)0x12bb6c;
    test_bson_iter_find_descendant_cold_1();
LAB_0012bb6c:
    pcStack_688 = (code *)0x12bb71;
    test_bson_iter_find_descendant_cold_2();
LAB_0012bb71:
    pcStack_688 = (code *)0x12bb76;
    test_bson_iter_find_descendant_cold_3();
LAB_0012bb76:
    pcStack_688 = (code *)0x12bb7b;
    test_bson_iter_find_descendant_cold_4();
LAB_0012bb7b:
    pcStack_688 = (code *)0x12bb80;
    test_bson_iter_find_descendant_cold_5();
LAB_0012bb80:
    pcStack_688 = (code *)0x12bb85;
    test_bson_iter_find_descendant_cold_6();
LAB_0012bb85:
    pcStack_688 = (code *)0x12bb8a;
    test_bson_iter_find_descendant_cold_7();
LAB_0012bb8a:
    pcStack_688 = (code *)0x12bb8f;
    test_bson_iter_find_descendant_cold_8();
LAB_0012bb8f:
    pcStack_688 = (code *)0x12bb94;
    test_bson_iter_find_descendant_cold_9();
LAB_0012bb94:
    pcStack_688 = (code *)0x12bb99;
    test_bson_iter_find_descendant_cold_10();
LAB_0012bb99:
    pcStack_688 = (code *)0x12bb9e;
    test_bson_iter_find_descendant_cold_11();
LAB_0012bb9e:
    pcStack_688 = (code *)0x12bba3;
    test_bson_iter_find_descendant_cold_12();
LAB_0012bba3:
    pcStack_688 = (code *)0x12bba8;
    test_bson_iter_find_descendant_cold_13();
  }
  else {
    pcStack_688 = (code *)0x12b95a;
    cVar1 = bson_iter_find_descendant(auStack_600,"a.b.c.0",auStack_680);
    if (cVar1 == '\0') goto LAB_0012bb6c;
    pcStack_688 = (code *)0x12b96a;
    iVar2 = bson_iter_type(auStack_680);
    if (iVar2 != 0x10) goto LAB_0012bb71;
    pcStack_688 = (code *)0x12b97b;
    iVar2 = bson_iter_int32(auStack_680);
    if (iVar2 != 1) goto LAB_0012bb76;
    pcStack_688 = (code *)0x12b98c;
    bson_destroy(pbVar3);
    pcStack_688 = (code *)0x12b991;
    pbVar3 = (bson_t *)bson_bcon_magic();
    pcStack_688 = (code *)0x0;
    pcStack_698 = "]";
    pbStack_6a0 = (bson_t *)0x148ce7;
    uStack_6a8 = 1;
    uStack_6b0 = 0xf;
    pcStack_6c0 = "baz";
    uStack_6c8 = 0x12b9e0;
    pbStack_6b8 = pbVar3;
    unaff_R14 = bcon_new(0,"foo","{","bar","[","{");
    pcStack_688 = (code *)0x12b9f7;
    cVar1 = bson_iter_init(auStack_600,unaff_R14);
    if (cVar1 == '\0') goto LAB_0012bb7b;
    pcStack_688 = (code *)0x12ba16;
    cVar1 = bson_iter_find_descendant(auStack_600,"foo.bar.0.baz",auStack_680);
    if (cVar1 == '\0') goto LAB_0012bb80;
    pcStack_688 = (code *)0x12ba26;
    iVar2 = bson_iter_type(auStack_680);
    if (iVar2 != 0x10) goto LAB_0012bb85;
    pcStack_688 = (code *)0x12ba37;
    iVar2 = bson_iter_int32(auStack_680);
    if (iVar2 != 1) goto LAB_0012bb8a;
    pcStack_688 = (code *)0x12ba48;
    bson_destroy(unaff_R14);
    pcStack_688 = (code *)0x0;
    pcStack_698 = (char *)0xf;
    uStack_6a8 = 0x12ba74;
    pbStack_6a0 = pbVar3;
    unaff_R14 = bcon_new(0,"nModified",pbVar3,0xf,1,"n");
    pcStack_688 = (code *)0x12ba8b;
    cVar1 = bson_iter_init(auStack_600,unaff_R14);
    if (cVar1 == '\0') goto LAB_0012bb8f;
    pcStack_688 = (code *)0x12baaa;
    cVar1 = bson_iter_find_descendant(auStack_600,"n",auStack_680);
    if (cVar1 == '\0') goto LAB_0012bb94;
    pcStack_688 = (code *)0x12baba;
    pcVar4 = (char *)bson_iter_key(auStack_680);
    pcStack_688 = (code *)0x12bac9;
    iVar2 = strcmp(pcVar4,"n");
    if (iVar2 != 0) goto LAB_0012bb99;
    pcStack_688 = (code *)0x12bad9;
    bson_destroy(unaff_R14);
    pcStack_688 = (code *)0x0;
    pcStack_698 = (char *)0xf;
    uStack_6a8 = 0x12bb05;
    pbStack_6a0 = pbVar3;
    pbVar3 = (bson_t *)bcon_new(0,"",pbVar3,0xf,1,"n");
    pcStack_688 = (code *)0x12bb1c;
    cVar1 = bson_iter_init(auStack_600,pbVar3);
    if (cVar1 == '\0') goto LAB_0012bb9e;
    pcStack_688 = (code *)0x12bb37;
    cVar1 = bson_iter_find_descendant(auStack_600,"n",auStack_680);
    if (cVar1 == '\0') goto LAB_0012bba3;
    pcStack_688 = (code *)0x12bb43;
    pcVar4 = (char *)bson_iter_key(auStack_680);
    pcStack_688 = (code *)0x12bb52;
    iVar2 = strcmp(pcVar4,"n");
    if (iVar2 == 0) {
      pcStack_688 = (code *)0x12bb5e;
      bson_destroy(pbVar3);
      return;
    }
  }
  pcStack_688 = test_bson_iter_as_bool;
  test_bson_iter_find_descendant_cold_14();
  pbVar7 = &bStack_880;
  pbVar8 = &bStack_880;
  pbVar9 = &bStack_880;
  pbVar6 = abStack_800;
  pcStack_888 = (code *)0x12bbd1;
  pbStack_6a0 = pbVar3;
  pcStack_698 = (char *)unaff_R14;
  pcStack_688 = (code *)&pcStack_508;
  bson_init(pbVar6);
  pcStack_888 = (code *)0x12bbea;
  bson_append_int32(pbVar6,"int32[true]",0xffffffff,1);
  pcStack_888 = (code *)0x12bc00;
  bson_append_int32(pbVar6,"int32[false]",0xffffffff,0);
  pcStack_888 = (code *)0x12bc1c;
  bson_append_int64(pbVar6,"int64[true]",0xffffffff,1);
  pcStack_888 = (code *)0x12bc35;
  bson_append_int64(pbVar6,"int64[false]",0xffffffff,0);
  pcStack_888 = (code *)0x12bc4d;
  bson_append_double(0x3ff0000000000000,pbVar6,"int64[true]",0xffffffff);
  pcStack_888 = (code *)0x12bc60;
  bson_append_double(0,pbVar6,"int64[false]",0xffffffff);
  pcStack_888 = (code *)0x12bc6e;
  bson_iter_init(&bStack_880,pbVar6);
  pcStack_888 = (code *)0x12bc76;
  bson_iter_next(&bStack_880);
  pcStack_888 = (code *)0x12bc7e;
  cVar1 = bson_iter_as_bool(&bStack_880);
  if (cVar1 == '\0') {
    pcStack_888 = (code *)0x12bd16;
    test_bson_iter_as_bool_cold_1();
LAB_0012bd16:
    pcStack_888 = (code *)0x12bd1b;
    test_bson_iter_as_bool_cold_6();
LAB_0012bd1b:
    pbVar7 = pbVar6;
    pcStack_888 = (code *)0x12bd20;
    test_bson_iter_as_bool_cold_2();
LAB_0012bd20:
    pcStack_888 = (code *)0x12bd25;
    test_bson_iter_as_bool_cold_5();
LAB_0012bd25:
    pbVar8 = pbVar7;
    pcStack_888 = (code *)0x12bd2a;
    test_bson_iter_as_bool_cold_3();
  }
  else {
    pcStack_888 = (code *)0x12bc91;
    bson_iter_next(&bStack_880);
    pcStack_888 = (code *)0x12bc99;
    cVar1 = bson_iter_as_bool(&bStack_880);
    pbVar6 = &bStack_880;
    if (cVar1 != '\0') goto LAB_0012bd16;
    pcStack_888 = (code *)0x12bca8;
    bson_iter_next(&bStack_880);
    pcStack_888 = (code *)0x12bcb0;
    cVar1 = bson_iter_as_bool(&bStack_880);
    pbVar6 = &bStack_880;
    if (cVar1 == '\0') goto LAB_0012bd1b;
    pcStack_888 = (code *)0x12bcbf;
    bson_iter_next(&bStack_880);
    pcStack_888 = (code *)0x12bcc7;
    cVar1 = bson_iter_as_bool(&bStack_880);
    if (cVar1 != '\0') goto LAB_0012bd20;
    pcStack_888 = (code *)0x12bcd6;
    bson_iter_next(&bStack_880);
    pcStack_888 = (code *)0x12bcde;
    cVar1 = bson_iter_as_bool(&bStack_880);
    pbVar7 = &bStack_880;
    if (cVar1 == '\0') goto LAB_0012bd25;
    pcStack_888 = (code *)0x12bced;
    bson_iter_next(&bStack_880);
    pcStack_888 = (code *)0x12bcf5;
    cVar1 = bson_iter_as_bool(&bStack_880);
    if (cVar1 == '\0') {
      pcStack_888 = (code *)0x12bd06;
      bson_destroy(abStack_800);
      return;
    }
  }
  pcStack_888 = test_bson_iter_binary_deprecated;
  test_bson_iter_as_bool_cold_4();
  pcStack_a08 = (code *)0x12bd4d;
  pbStack_898 = pbVar8;
  puStack_890 = (undefined1 *)&bStack_880;
  pcStack_888 = (code *)&pcStack_688;
  pbVar3 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/binary_deprecated.bson"
                   );
  if (pbVar3 == (bson_t *)0x0) {
    pcStack_a08 = (code *)0x12bdc2;
    test_bson_iter_binary_deprecated_cold_5();
LAB_0012bdc2:
    pcStack_a08 = (code *)0x12bdc7;
    test_bson_iter_binary_deprecated_cold_1();
LAB_0012bdc7:
    pcStack_a08 = (code *)0x12bdcc;
    test_bson_iter_binary_deprecated_cold_2();
LAB_0012bdcc:
    pcStack_a08 = (code *)0x12bdd1;
    test_bson_iter_binary_deprecated_cold_3();
  }
  else {
    pcStack_a08 = (code *)0x12bd65;
    cVar1 = bson_iter_init(auStack_980,pbVar3);
    pbVar8 = pbVar3;
    if (cVar1 == '\0') goto LAB_0012bdc2;
    pcStack_a08 = (code *)0x12bd76;
    cVar1 = bson_iter_next(auStack_980);
    if (cVar1 == '\0') goto LAB_0012bdc7;
    pbVar9 = (bson_t *)&iStack_988;
    pcStack_a08 = (code *)0x12bd99;
    bson_iter_binary(auStack_980,auStack_984,pbVar9,&piStack_990);
    if (iStack_988 != 4) goto LAB_0012bdcc;
    if (*piStack_990 == 0x34333231) {
      pcStack_a08 = (code *)0x12bdb4;
      bson_destroy(pbVar3);
      return;
    }
  }
  pcStack_a08 = test_bson_iter_from_data;
  test_bson_iter_binary_deprecated_cold_4();
  uStack_b10 = 0x100620800000009;
  uStack_b08 = 0;
  suite = aTStack_b00;
  pcStack_b88 = (code *)0x12be0d;
  pcStack_a08 = (code *)&pcStack_888;
  cVar1 = bson_iter_init_from_data(suite,&uStack_b10,9);
  if (cVar1 == '\0') {
    pcStack_b88 = (code *)0x12be4f;
    test_bson_iter_from_data_cold_1();
LAB_0012be4f:
    pcStack_b88 = (code *)0x12be54;
    test_bson_iter_from_data_cold_2();
LAB_0012be54:
    pcStack_b88 = (code *)0x12be59;
    test_bson_iter_from_data_cold_3();
  }
  else {
    suite = aTStack_b00;
    pcStack_b88 = (code *)0x12be1e;
    cVar1 = bson_iter_next();
    if (cVar1 == '\0') goto LAB_0012be4f;
    suite = aTStack_b00;
    pcStack_b88 = (code *)0x12be2f;
    iVar2 = bson_iter_type();
    if (iVar2 != 8) goto LAB_0012be54;
    suite = aTStack_b00;
    pcStack_b88 = (code *)0x12be41;
    cVar1 = bson_iter_bool();
    if (cVar1 != '\0') {
      return;
    }
  }
  pcStack_b88 = get_bson;
  test_bson_iter_from_data_cold_4();
  pbStack_b90 = pbVar8;
  pcStack_b88 = (code *)pbVar9;
  iVar2 = open((char *)suite,0);
  if (iVar2 != -1) {
    uVar5 = read(iVar2,auStack_1b98,0x1000);
    if ((long)uVar5 < 0) goto LAB_0012bec0;
    if (uVar5 != 0) {
      bson_new_from_data(auStack_1b98,uVar5 & 0xffffffff);
      close(iVar2);
      return;
    }
    get_bson_cold_1();
  }
  get_bson_cold_3();
LAB_0012bec0:
  get_bson_cold_2();
  TestSuite_Add(suite,"/bson/as_json/x1000",test_bson_as_json_x1000);
  TestSuite_Add(suite,"/bson/as_json/multi",test_bson_as_json_multi);
  TestSuite_Add(suite,"/bson/as_json/string",test_bson_as_json_string);
  TestSuite_Add(suite,"/bson/as_json/int32",test_bson_as_json_int32);
  TestSuite_Add(suite,"/bson/as_json/int64",test_bson_as_json_int64);
  TestSuite_Add(suite,"/bson/as_json/double",test_bson_as_json_double);
  TestSuite_Add(suite,"/bson/as_json/double/nonfinite",test_bson_as_json_double_nonfinite);
  TestSuite_Add(suite,"/bson/as_json/code",test_bson_as_json_code);
  TestSuite_Add(suite,"/bson/as_json/date_time",test_bson_as_json_date_time);
  TestSuite_Add(suite,"/bson/as_json/regex",test_bson_as_json_regex);
  TestSuite_Add(suite,"/bson/as_json/symbol",test_bson_as_json_symbol);
  TestSuite_Add(suite,"/bson/as_json/utf8",test_bson_as_json_utf8);
  TestSuite_Add(suite,"/bson/as_json/dbpointer",test_bson_as_json_dbpointer);
  TestSuite_Add(suite,"/bson/as_canonical_extended_json/dbpointer",
                test_bson_as_canonical_extended_json_dbpointer);
  TestSuite_Add(suite,"/bson/as_json/stack_overflow",test_bson_as_json_stack_overflow);
  TestSuite_Add(suite,"/bson/as_json/corrupt",test_bson_corrupt);
  TestSuite_Add(suite,"/bson/as_json/corrupt_utf8",test_bson_corrupt_utf8);
  TestSuite_Add(suite,"/bson/as_json/corrupt_binary",test_bson_corrupt_binary);
  TestSuite_Add(suite,"/bson/as_json_spacing",test_bson_as_json_spacing);
  TestSuite_Add(suite,"/bson/array_as_json",test_bson_array_as_json);
  TestSuite_Add(suite,"/bson/json/allow_multiple",test_bson_json_allow_multiple);
  TestSuite_Add(suite,"/bson/json/read/buffering",test_bson_json_read_buffering);
  TestSuite_Add(suite,"/bson/json/read",test_bson_json_read);
  TestSuite_Add(suite,"/bson/json/inc",test_bson_json_inc);
  TestSuite_Add(suite,"/bson/json/array",test_bson_json_array);
  TestSuite_Add(suite,"/bson/json/array/single",test_bson_json_array_single);
  TestSuite_Add(suite,"/bson/json/array/int64",test_bson_json_array_int64);
  TestSuite_Add(suite,"/bson/json/array/subdoc",test_bson_json_array_subdoc);
  TestSuite_Add(suite,"/bson/json/date",test_bson_json_date);
  TestSuite_Add(suite,"/bson/json/date/legacy",test_bson_json_date_legacy);
  TestSuite_Add(suite,"/bson/json/date/long",test_bson_json_date_numberlong);
  TestSuite_Add(suite,"/bson/json/timestamp",test_bson_json_timestamp);
  TestSuite_Add(suite,"/bson/json/read/empty",test_bson_json_read_empty);
  TestSuite_Add(suite,"/bson/json/read/missing_complex",test_bson_json_read_missing_complex);
  TestSuite_Add(suite,"/bson/json/read/invalid_binary",test_bson_json_read_invalid_binary);
  TestSuite_Add(suite,"/bson/json/read/invalid_json",test_bson_json_read_invalid_json);
  TestSuite_Add(suite,"/bson/json/read/bad_cb",test_bson_json_read_bad_cb);
  TestSuite_Add(suite,"/bson/json/read/invalid",test_bson_json_read_invalid);
  TestSuite_Add(suite,"/bson/json/read/raw_utf8",test_bson_json_read_raw_utf8);
  TestSuite_Add(suite,"/bson/json/read/corrupt_utf8",test_bson_json_read_corrupt_utf8);
  TestSuite_Add(suite,"/bson/json/read/decimal128",test_bson_json_read_decimal128);
  TestSuite_Add(suite,"/bson/json/read/dbpointer",test_bson_json_read_dbpointer);
  TestSuite_Add(suite,"/bson/json/read/legacy_regex",test_bson_json_read_legacy_regex);
  TestSuite_Add(suite,"/bson/json/read/regex_options_order",test_bson_json_read_regex_options_order)
  ;
  TestSuite_Add(suite,"/bson/json/read/binary",test_bson_json_read_binary);
  TestSuite_Add(suite,"/bson/json/read/legacy_binary",test_bson_json_read_legacy_binary);
  TestSuite_Add(suite,"/bson/json/read/file",test_json_reader_new_from_file);
  TestSuite_Add(suite,"/bson/json/read/bad_path",test_json_reader_new_from_bad_path);
  TestSuite_Add(suite,"/bson/json/read/$numberLong",test_bson_json_number_long);
  TestSuite_Add(suite,"/bson/json/read/$numberLong/zero",test_bson_json_number_long_zero);
  TestSuite_Add(suite,"/bson/json/read/code",test_bson_json_code);
  TestSuite_Add(suite,"/bson/json/read/code/errors",test_bson_json_code_errors);
  TestSuite_Add(suite,"/bson/json/read/dbref",test_bson_json_dbref);
  TestSuite_Add(suite,"/bson/json/read/uescape",test_bson_json_uescape);
  TestSuite_Add(suite,"/bson/json/read/uescape/key",test_bson_json_uescape_key);
  TestSuite_Add(suite,"/bson/json/read/uescape/bad",test_bson_json_uescape_bad);
  TestSuite_Add(suite,"/bson/json/read/int32",test_bson_json_int32);
  TestSuite_Add(suite,"/bson/json/read/int64",test_bson_json_int64);
  TestSuite_Add(suite,"/bson/json/read/double",test_bson_json_double);
  TestSuite_Add(suite,"/bson/json/read/double/overflow",test_bson_json_double_overflow);
  TestSuite_Add(suite,"/bson/json/read/double/nan",test_bson_json_nan);
  TestSuite_Add(suite,"/bson/json/read/double/infinity",test_bson_json_infinity);
  TestSuite_Add(suite,"/bson/json/read/null",test_bson_json_null);
  TestSuite_Add(suite,"/bson/json/read/empty_final",test_bson_json_empty_final_object);
  TestSuite_Add(suite,"/bson/as_json/decimal128",test_bson_as_json_decimal128);
  TestSuite_Add(suite,"/bson/json/read/$numberDecimal",test_bson_json_number_decimal);
  TestSuite_Add(suite,"/bson/json/errors",test_bson_json_errors);
  TestSuite_Add(suite,"/bson/integer/width",test_bson_integer_width);
  TestSuite_Add(suite,"/bson/json/read/null_in_str",test_bson_json_null_in_str);
  TestSuite_Add(suite,"/bson/as_json/multi_object",test_bson_as_json_multi_object);
  return;
}

Assistant:

static void
test_bson_iter_recurse (void)
{
   bson_iter_t iter;
   bson_iter_t child;
   bson_t b;
   bson_t cb;

   bson_init (&b);
   bson_init (&cb);
   BSON_ASSERT (bson_append_int32 (&cb, "0", 1, 0));
   BSON_ASSERT (bson_append_int32 (&cb, "1", 1, 1));
   BSON_ASSERT (bson_append_int32 (&cb, "2", 1, 2));
   BSON_ASSERT (bson_append_array (&b, "key", -1, &cb));
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_ARRAY (&iter));
   BSON_ASSERT (bson_iter_recurse (&iter, &child));
   BSON_ASSERT (bson_iter_find (&child, "0"));
   BSON_ASSERT (bson_iter_find (&child, "1"));
   BSON_ASSERT (bson_iter_find (&child, "2"));
   BSON_ASSERT (!bson_iter_next (&child));
   bson_destroy (&b);
   bson_destroy (&cb);
}